

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NodeMinimumBase(Abc_Obj_t *pNode)

{
  int nCap;
  DdNode *bF;
  uint __line;
  int iVar1;
  Vec_Str_t *vSupport;
  char *pcVar2;
  Vec_Ptr_t *vNodes;
  DdNode *n;
  long lVar3;
  int iVar4;
  
  if ((pNode->pNtk->ntkFunc == ABC_FUNC_BDD) && (pNode->pNtk->ntkType == ABC_NTK_LOGIC)) {
    if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
      vSupport = (Vec_Str_t *)malloc(0x10);
      vSupport->nCap = 0x10;
      vSupport->nSize = 0;
      pcVar2 = (char *)malloc(0x10);
      vSupport->pArray = pcVar2;
      iVar1 = Abc_NodeSupport((DdNode *)((ulong)(pNode->field_5).pData & 0xfffffffffffffffe),
                              vSupport,(pNode->vFanins).nSize);
      nCap = (pNode->vFanins).nSize;
      iVar4 = 0;
      if (iVar1 != nCap) {
        vNodes = Vec_PtrAlloc(nCap);
        Abc_NodeCollectFanins(pNode,vNodes);
        for (lVar3 = 0; lVar3 < vNodes->nSize; lVar3 = lVar3 + 1) {
          if (vSupport->pArray[lVar3] == '\0') {
            Abc_ObjDeleteFanin(pNode,(Abc_Obj_t *)vNodes->pArray[lVar3]);
          }
        }
        if (iVar1 != (pNode->vFanins).nSize) {
          pcVar2 = "nVars == Abc_ObjFaninNum(pNode)";
          __line = 100;
          goto LAB_006bdb15;
        }
        bF = (DdNode *)(pNode->field_5).pData;
        n = Extra_bddRemapUp((DdManager *)pNode->pNtk->pManFunc,bF);
        (pNode->field_5).pData = n;
        Cudd_Ref(n);
        Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,bF);
        Vec_PtrFree(vNodes);
        iVar4 = 1;
      }
      Vec_StrFree(vSupport);
      return iVar4;
    }
    pcVar2 = "Abc_ObjIsNode(pNode)";
    __line = 0x53;
  }
  else {
    pcVar2 = "Abc_NtkIsBddLogic(pNode->pNtk)";
    __line = 0x52;
  }
LAB_006bdb15:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcMinBase.c"
                ,__line,"int Abc_NodeMinimumBase(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeMinimumBase( Abc_Obj_t * pNode )
{
    Vec_Str_t * vSupport;
    Vec_Ptr_t * vFanins;
    DdNode * bTemp;
    int i, nVars;

    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );

    // compute support
    vSupport = Vec_StrAlloc( 10 );
    nVars = Abc_NodeSupport( Cudd_Regular(pNode->pData), vSupport, Abc_ObjFaninNum(pNode) );
    if ( nVars == Abc_ObjFaninNum(pNode) )
    {
        Vec_StrFree( vSupport );
        return 0;
    }

    // remove unused fanins
    vFanins = Vec_PtrAlloc( Abc_ObjFaninNum(pNode) );
    Abc_NodeCollectFanins( pNode, vFanins );
    for ( i = 0; i < vFanins->nSize; i++ )
        if ( vSupport->pArray[i] == 0 )
            Abc_ObjDeleteFanin( pNode, (Abc_Obj_t *)vFanins->pArray[i] );
    assert( nVars == Abc_ObjFaninNum(pNode) );

    // update the function of the node
    pNode->pData = Extra_bddRemapUp( (DdManager *)pNode->pNtk->pManFunc, bTemp = (DdNode *)pNode->pData );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, bTemp );
    Vec_PtrFree( vFanins );
    Vec_StrFree( vSupport );
    return 1;
}